

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_iarchive.h
# Opt level: O2

void __thiscall serialization::json_iarchive::load(json_iarchive *this,int *v)

{
  int iVar1;
  _Elt_pointer ppGVar2;
  _Elt_pointer ppGVar3;
  _Elt_pointer ppGVar4;
  
  ppGVar2 = (this->stack_).c.
            super__Deque_base<const_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_*,_std::allocator<const_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_*>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (ppGVar2 !=
      (this->stack_).c.
      super__Deque_base<const_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_*,_std::allocator<const_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_*>_>
      ._M_impl.super__Deque_impl_data._M_start._M_cur) {
    ppGVar3 = (this->stack_).c.
              super__Deque_base<const_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_*,_std::allocator<const_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_*>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_first;
    ppGVar4 = ppGVar2;
    if (ppGVar2 == ppGVar3) {
      ppGVar4 = (this->stack_).c.
                super__Deque_base<const_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_*,_std::allocator<const_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_*>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    if ((undefined1  [16])
        ((undefined1  [16])ppGVar4[-1]->data_ & (undefined1  [16])0x20000000000000) !=
        (undefined1  [16])0x0) goto LAB_00119a57;
  }
  throw_serialization_error("json","expect int");
  ppGVar2 = (this->stack_).c.
            super__Deque_base<const_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_*,_std::allocator<const_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_*>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  ppGVar3 = (this->stack_).c.
            super__Deque_base<const_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_*,_std::allocator<const_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_*>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_first;
LAB_00119a57:
  if (ppGVar2 == ppGVar3) {
    ppGVar2 = (this->stack_).c.
              super__Deque_base<const_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_*,_std::allocator<const_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_*>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
  }
  iVar1 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::GetInt(ppGVar2[-1]);
  *v = iVar1;
  return;
}

Assistant:

void load(int & v) const
    {
        if(stack_.empty() || (!stack_.top()->IsInt()))
            throw_serialization_error("json", "expect int");
        v = stack_.top()->GetInt();
    }